

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::ListValue::ByteSizeLong(ListValue *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Rep *pRVar4;
  size_t sVar5;
  anon_union_32_1_493b367e_for_ListValue_3 *this_00;
  size_t sVar6;
  anon_union_32_1_493b367e_for_ListValue_3 *paVar7;
  
  sVar6 = (size_t)*(int *)((long)&this->field_0 + 8);
  this_00 = &this->field_0;
  paVar7 = this_00;
  if ((undefined1  [32])((undefined1  [32])this->field_0 & (undefined1  [32])0x1) !=
      (undefined1  [32])0x0) {
    pRVar4 = protobuf::internal::RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)&this_00->_impl_)
    ;
    paVar7 = (anon_union_32_1_493b367e_for_ListValue_3 *)pRVar4->elements;
  }
  if ((undefined1  [32])((undefined1  [32])*this_00 & (undefined1  [32])0x1) !=
      (undefined1  [32])0x0) {
    pRVar4 = protobuf::internal::RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)&this_00->_impl_)
    ;
    this_00 = (anon_union_32_1_493b367e_for_ListValue_3 *)pRVar4->elements;
  }
  iVar1 = *(int *)((long)&this->field_0 + 8);
  for (; paVar7 != (anon_union_32_1_493b367e_for_ListValue_3 *)((long)this_00 + (long)iVar1 * 8);
      paVar7 = (anon_union_32_1_493b367e_for_ListValue_3 *)((long)paVar7 + 8)) {
    sVar5 = Value::ByteSizeLong((Value *)(paVar7->_impl_).values_.super_RepeatedPtrFieldBase.
                                         tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar6 = sVar6 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t ListValue::ByteSizeLong() const {
  const ListValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ListValue)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.Value values = 1;
    {
      total_size += 1UL * this_._internal_values_size();
      for (const auto& msg : this_._internal_values()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}